

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_opts.c
# Opt level: O1

int set_field_opts(FIELD *field,Field_Options opts)

{
  int iVar1;
  int *piVar2;
  
  if (field == (FIELD *)0x0) {
    field = _nc_Default_Field;
  }
  iVar1 = _nc_Synchronize_Options(field,opts & 0x3ff);
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return iVar1;
}

Assistant:

int set_field_opts(FIELD * field, Field_Options opts)
{
  int res = E_BAD_ARGUMENT;
  opts &= ALL_FIELD_OPTS;
  if (!(opts & ~ALL_FIELD_OPTS))
    res = _nc_Synchronize_Options( Normalize_Field(field), opts );
  RETURN(res);
}